

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::ParameterSetupErrorsTest::TestIuiv
          (ParameterSetupErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  ErrorsUtilities *pEVar11;
  GLuint min_filter_invalid;
  GLuint wrap_invalid;
  GLuint one;
  GLuint depth_stencil_mode_invalid;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  GLenum local_34;
  long lVar10;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar9);
  local_38 = 1;
  local_34 = this->m_depth_stencil_mode_invalid;
  local_3c = 0x8743;
  local_40 = 0x2700;
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar10 + 0x1410))(pEVar11,this->m_pname_invalid,&local_38);
  bVar1 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x500,"glTextureParameterIuiv",
                     "pname is not one of the accepted defined values.");
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_2D;
  (**(code **)(lVar10 + 0x1410))(pEVar11,0x90ea,&local_34);
  bVar2 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x500,"glTextureParameterIuiv",
                     "params should have a defined constant value (based on the value of pname) and does not."
                    );
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar10 + 0x1410))(pEVar11,0x8501,&local_38);
  bVar3 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x500,"glTextureParameterIuiv",
                     "the  effective target is either TEXTURE_2D_MULTISAMPLE or  TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states."
                    );
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar10 + 0x1410))(pEVar11,0x2802,&local_3c);
  bVar4 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x500,"glTextureParameterIuiv",
                     "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT."
                    );
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar10 + 0x1410))(pEVar11,0x2801,&local_40);
  bVar5 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x500,"glTextureParameterIuiv",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a value other than NEAREST or LINEAR (no mipmap filtering is permitted)."
                    );
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_2D_ms;
  (**(code **)(lVar10 + 0x1410))(pEVar11,0x813c,&local_38);
  bVar6 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x502,"glTextureParameterIuiv",
                     "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a value other than zero."
                    );
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_invalid;
  (**(code **)(lVar10 + 0x1410))(pEVar11,0x8501,&local_38);
  bVar7 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x502,"glTextureParameterIuiv",
                     "texture is not the name of an existing texture object.");
  pEVar11 = (ErrorsUtilities *)(ulong)this->m_to_rectangle;
  (**(code **)(lVar10 + 0x1410))(pEVar11,0x813c,&local_38);
  bVar8 = ErrorsUtilities::CheckErrorAndLog
                    (pEVar11,(this->super_TestCase).m_context,0x502,"glTextureParameterIuiv",
                     "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to any value other than zero. "
                    );
  return bVar8 && ((bVar7 && (bVar6 && bVar5)) && ((bVar4 && bVar3) && (bVar2 && bVar1)));
}

Assistant:

bool ParameterSetupErrorsTest::TestIuiv()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	glw::GLuint one						   = 1;
	glw::GLuint depth_stencil_mode_invalid = (glw::GLint)m_depth_stencil_mode_invalid;
	glw::GLuint wrap_invalid			   = (glw::GLint)GL_MIRROR_CLAMP_TO_EDGE;
	glw::GLuint min_filter_invalid		   = (glw::GLint)GL_NEAREST_MIPMAP_NEAREST;

	/* Check that INVALID_ENUM is generated by TextureParameter* if pname is
	 not one of the accepted defined values. */
	{
		gl.textureParameterIuiv(m_to_2D, m_pname_invalid, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIuiv",
								  "pname is not one of the accepted defined values.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if params
	 should have a defined constant value (based on the value of pname) and
	 does not. */
	{
		gl.textureParameterIuiv(m_to_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, &depth_stencil_mode_invalid);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIuiv",
							 "params should have a defined constant value (based on the value of pname) and does not.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states. */
	{
		gl.textureParameterIuiv(m_to_2D_ms, GL_TEXTURE_LOD_BIAS, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIuiv",
								  "the  effective target is either TEXTURE_2D_MULTISAMPLE or  "
								  "TEXTURE_2D_MULTISAMPLE_ARRAY, and pname is any of the sampler states.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and either of pnames
	 TEXTURE_WRAP_S or TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE,
	 MIRRORED_REPEAT or REPEAT. */
	{
		gl.textureParameterIuiv(m_to_rectangle, GL_TEXTURE_WRAP_S, &wrap_invalid);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIuiv",
								  "the effective target is TEXTURE_RECTANGLE and either of pnames TEXTURE_WRAP_S or "
								  "TEXTURE_WRAP_T is set to either MIRROR_CLAMP_TO_EDGE, MIRRORED_REPEAT or REPEAT.");
	}

	/* Check that INVALID_ENUM is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is
	 set to a value other than NEAREST or LINEAR (no mipmap filtering is
	 permitted). */
	{
		gl.textureParameterIuiv(m_to_rectangle, GL_TEXTURE_MIN_FILTER, &min_filter_invalid);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glTextureParameterIuiv",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_MIN_FILTER is set to a "
								  "value other than NEAREST or LINEAR (no mipmap filtering is permitted).");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is either TEXTURE_2D_MULTISAMPLE or
	 TEXTURE_2D_MULTISAMPLE_ARRAY, and pname TEXTURE_BASE_LEVEL is set to a
	 value other than zero. */
	{
		gl.textureParameterIuiv(m_to_2D_ms, GL_TEXTURE_BASE_LEVEL, &one);

		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterIuiv",
							 "the effective target is either TEXTURE_2D_MULTISAMPLE or TEXTURE_2D_MULTISAMPLE_ARRAY, "
							 "and pname TEXTURE_BASE_LEVEL is set to a value other than zero.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if
	 texture is not the name of an existing texture object. */
	{
		gl.textureParameterIuiv(m_to_invalid, GL_TEXTURE_LOD_BIAS, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterIuiv",
								  "texture is not the name of an existing texture object.");
	}

	/* Check that INVALID_OPERATION is generated by TextureParameter* if the
	 effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is
	 set to any value other than zero. */
	{
		gl.textureParameterIuiv(m_to_rectangle, GL_TEXTURE_BASE_LEVEL, &one);

		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glTextureParameterIuiv",
								  "the effective target is TEXTURE_RECTANGLE and pname TEXTURE_BASE_LEVEL is set to "
								  "any value other than zero. ");
	}

	return is_ok;
}